

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSpeedup.c
# Opt level: O2

uint Abc_NtkDelayTraceTCEdges(Abc_Ntk_t *pNtk,Abc_Obj_t *pNode,float tDelta,int fUseLutLib)

{
  float *pfVar1;
  float fVar2;
  Abc_Ntk_t *pAVar3;
  long *plVar4;
  uint uVar5;
  void *pvVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  int pPinPerm [32];
  float pPinDelays [32];
  
  if (fUseLutLib == 0) {
    pvVar6 = (void *)0x0;
  }
  else {
    pvVar6 = Abc_FrameReadLibLut();
  }
  pAVar3 = pNode->pNtk;
  fVar2 = pAVar3->pLutTimes[(long)pNode->Id * 3 + 1];
  if (pvVar6 == (void *)0x0) {
    uVar5 = (pNode->vFanins).nSize;
    uVar7 = (ulong)uVar5;
    if ((int)uVar5 < 1) {
      uVar7 = 0;
    }
    uVar5 = 0;
    for (uVar8 = 0; uVar7 != uVar8; uVar8 = uVar8 + 1) {
      plVar4 = (long *)pAVar3->vObjs->pArray[(pNode->vFanins).pArray[uVar8]];
      uVar9 = 1 << ((byte)uVar8 & 0x1f);
      if (*(float *)(*(long *)(*plVar4 + 400) + (long)(int)plVar4[2] * 0xc) + 1.0 + tDelta <= fVar2)
      {
        uVar9 = 0;
      }
      uVar5 = uVar5 | uVar9;
    }
  }
  else {
    uVar5 = (pNode->vFanins).nSize;
    pfVar1 = (float *)((long)pvVar6 + (long)(int)uVar5 * 0x84 + 0x94);
    if (*(int *)((long)pvVar6 + 0xc) == 0) {
      uVar7 = (ulong)uVar5;
      if ((int)uVar5 < 1) {
        uVar7 = 0;
      }
      uVar5 = 0;
      for (uVar8 = 0; uVar7 != uVar8; uVar8 = uVar8 + 1) {
        plVar4 = (long *)pAVar3->vObjs->pArray[(pNode->vFanins).pArray[uVar8]];
        uVar9 = 1 << ((byte)uVar8 & 0x1f);
        if (*(float *)(*(long *)(*plVar4 + 400) + (long)(int)plVar4[2] * 0xc) + *pfVar1 + tDelta <=
            fVar2) {
          uVar9 = 0;
        }
        uVar5 = uVar5 | uVar9;
      }
    }
    else {
      Abc_NtkDelayTraceSortPins(pNode,pPinPerm,pPinDelays);
      uVar5 = (pNode->vFanins).nSize;
      uVar7 = (ulong)uVar5;
      if ((int)uVar5 < 1) {
        uVar7 = 0;
      }
      uVar5 = 0;
      for (uVar8 = 0; uVar7 != uVar8; uVar8 = uVar8 + 1) {
        plVar4 = (long *)pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[pPinPerm[uVar8]]];
        uVar9 = 1 << ((byte)pPinPerm[uVar8] & 0x1f);
        if (*(float *)(*(long *)(*plVar4 + 400) + (long)(int)plVar4[2] * 0xc) + pfVar1[uVar8] +
            tDelta <= fVar2) {
          uVar9 = 0;
        }
        uVar5 = uVar5 | uVar9;
      }
    }
  }
  return uVar5;
}

Assistant:

unsigned Abc_NtkDelayTraceTCEdges( Abc_Ntk_t * pNtk, Abc_Obj_t * pNode, float tDelta, int fUseLutLib )
{
    int pPinPerm[32];
    float pPinDelays[32];
    If_LibLut_t * pLutLib;
    Abc_Obj_t * pFanin;
    unsigned uResult = 0;
    float tRequired, * pDelays;
    int k;
    pLutLib = fUseLutLib?  (If_LibLut_t *)Abc_FrameReadLibLut() : NULL;
    tRequired = Abc_ObjRequired(pNode);
    if ( pLutLib == NULL )
    {
        Abc_ObjForEachFanin( pNode, pFanin, k )
            if ( tRequired < Abc_ObjArrival(pFanin) + 1.0 + tDelta )
                uResult |= (1 << k);
    }
    else if ( !pLutLib->fVarPinDelays )
    {
        pDelays = pLutLib->pLutDelays[Abc_ObjFaninNum(pNode)];
        Abc_ObjForEachFanin( pNode, pFanin, k )
            if ( tRequired < Abc_ObjArrival(pFanin) + pDelays[0] + tDelta )
                uResult |= (1 << k);
    }
    else
    {
        pDelays = pLutLib->pLutDelays[Abc_ObjFaninNum(pNode)];
        Abc_NtkDelayTraceSortPins( pNode, pPinPerm, pPinDelays );
        Abc_ObjForEachFanin( pNode, pFanin, k )
            if ( tRequired < Abc_ObjArrival(Abc_ObjFanin(pNode,pPinPerm[k])) + pDelays[k] + tDelta )
                uResult |= (1 << pPinPerm[k]);
    }
    return uResult;
}